

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_test_tests.cpp
# Opt level: O2

void __thiscall
iu_TypedTest_x_iutest_x_StaticMul2_Test<long>::Body
          (iu_TypedTest_x_iutest_x_StaticMul2_Test<long> *this)

{
  long *in_R9;
  iuCodeMessage local_1e8;
  AssertionResult iutest_ar;
  Fixed local_190;
  
  TypedTest<long>::value = 1;
  local_190.super_Message.m_stream.super_iu_stringstream._0_8_ = 2;
  local_1e8.m_message._M_dataplus._M_p = (pointer)0x2;
  iutest::internal::CmpHelperEQ<long,long>
            (&iutest_ar,(internal *)"TestFixture::value+TestFixture::value","2*TestFixture::value",
             (char *)&local_190,(long *)&local_1e8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/typed_test_tests.cpp"
               ,0x2f,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_190);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest, StaticMul2)
{
    TestFixture::value = 1;
    IUTEST_ASSERT_EQ(TestFixture::value+TestFixture::value, 2*TestFixture::value);
}